

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

optional_ptr<duckdb::SchemaCatalogEntry,_true>
duckdb::Catalog::GetSchema
          (CatalogEntryRetriever *retriever,string *catalog_name,EntryLookupInfo *schema_lookup,
          OnEntryNotFound if_not_found)

{
  bool bVar1;
  Catalog *pCVar2;
  ClientContext *context;
  optional_ptr<duckdb::Catalog,_true> oVar3;
  undefined8 uVar4;
  char in_CL;
  EntryLookupInfo *in_RDX;
  string *in_RSI;
  CatalogEntryRetriever *in_RDI;
  OnEntryNotFound on_not_found;
  optional_ptr<duckdb::Catalog,_true> catalog;
  idx_t i;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> result;
  size_type in_stack_fffffffffffffeb8;
  vector<duckdb::CatalogSearchEntry,_true> *in_stack_fffffffffffffec0;
  allocator *paVar5;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> in_stack_fffffffffffffee0;
  ClientContext *in_stack_fffffffffffffee8;
  OnEntryNotFound if_not_found_00;
  Catalog *this;
  string local_b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  CatalogException *in_stack_ffffffffffffff68;
  optional_idx in_stack_ffffffffffffff70;
  Catalog *local_50;
  Catalog *local_48;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_40;
  char local_21;
  EntryLookupInfo *local_20;
  CatalogEntryRetriever *this_00;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> in_stack_fffffffffffffff8;
  
  local_21 = in_CL;
  local_20 = in_RDX;
  EntryLookupInfo::GetEntryName_abi_cxx11_(in_RDX);
  GetCatalogEntries((CatalogEntryRetriever *)in_stack_fffffffffffffff8.ptr,(string *)in_RDI,in_RSI);
  local_48 = (Catalog *)0x0;
  while (this = local_48,
        pCVar2 = (Catalog *)
                 ::std::
                 vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
                 size(&local_40), this < pCVar2) {
    this_00 = in_RDI;
    context = (ClientContext *)
              vector<duckdb::CatalogSearchEntry,_true>::operator[]
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    oVar3 = GetCatalogEntry((CatalogEntryRetriever *)in_stack_fffffffffffffee8,
                            (string *)in_stack_fffffffffffffee0.ptr);
    local_50 = oVar3.ptr;
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_50);
    if_not_found_00 = (OnEntryNotFound)((ulong)oVar3.ptr >> 0x38);
    if (bVar1) {
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::size
                (&local_40);
      optional_ptr<duckdb::Catalog,_true>::operator->
                ((optional_ptr<duckdb::Catalog,_true> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffee8 = CatalogEntryRetriever::GetContext(this_00);
      in_stack_fffffffffffffee0 = GetSchema(this,context,(EntryLookupInfo *)in_RDI,if_not_found_00);
      in_stack_fffffffffffffff8 = in_stack_fffffffffffffee0;
      bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0xfffffffffffffff8);
      if (bVar1) goto LAB_00298204;
    }
    local_48 = (Catalog *)((long)&local_48->_vptr_Catalog + 1);
    in_RDI = this_00;
  }
  if (local_21 == '\0') {
    uVar4 = __cxa_allocate_exception(0x10);
    EntryLookupInfo::GetErrorContext(local_20);
    paVar5 = (allocator *)&stack0xffffffffffffff6f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"Catalog with name %s does not exist!",paVar5);
    ::std::__cxx11::string::string(local_b8,(string *)in_RSI);
    CatalogException::CatalogException<std::__cxx11::string>
              (in_stack_ffffffffffffff68,(QueryErrorContext)in_stack_ffffffffffffff70.index,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_throw(uVar4,&CatalogException::typeinfo,CatalogException::~CatalogException);
  }
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr
            ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)&stack0xfffffffffffffff8,
             (SchemaCatalogEntry *)0x0);
LAB_00298204:
  vector<duckdb::CatalogSearchEntry,_true>::~vector
            ((vector<duckdb::CatalogSearchEntry,_true> *)0x298211);
  return (optional_ptr<duckdb::SchemaCatalogEntry,_true>)in_stack_fffffffffffffff8.ptr;
}

Assistant:

optional_ptr<SchemaCatalogEntry> Catalog::GetSchema(CatalogEntryRetriever &retriever, const string &catalog_name,
                                                    const EntryLookupInfo &schema_lookup,
                                                    OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog_name, schema_lookup.GetEntryName());
	for (idx_t i = 0; i < entries.size(); i++) {
		auto catalog = Catalog::GetCatalogEntry(retriever, entries[i].catalog);
		if (!catalog) {
			// skip if it is not an attached database
			continue;
		}
		const auto on_not_found = i + 1 == entries.size() ? if_not_found : OnEntryNotFound::RETURN_NULL;
		auto result = catalog->GetSchema(retriever.GetContext(), schema_lookup, on_not_found);
		if (result) {
			return result;
		}
	}
	// Catalog has not been found.
	if (if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		throw CatalogException(schema_lookup.GetErrorContext(), "Catalog with name %s does not exist!", catalog_name);
	}
	return nullptr;
}